

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_state_utils.cpp
# Opt level: O0

void Redistribution::MakeStateRedistUtils
               (Box *bx,Array4<const_amrex::EBCellFlag> *flag,Array4<const_double> *vfrac,
               Array4<const_double> *ccent,Array4<const_int> *itracker,Array4<double> *nrs,
               Array4<double> *alpha,Array4<double> *nbhd_vol,Array4<double> *cent_hat,
               Geometry *lev_geom,Real target_vol)

{
  Box *pBVar1;
  void *in_RCX;
  void *in_RDX;
  void *in_RSI;
  int *in_RDI;
  void *in_R8;
  void *in_R9;
  undefined8 in_XMM0_Qa;
  void *in_stack_00000008;
  void *in_stack_00000010;
  void *in_stack_00000018;
  Geometry *in_stack_00000020;
  Box domain_per_grown;
  Box domain;
  Box result_2;
  Box *bxg4;
  Box result_1;
  Box *bxg3;
  Box result;
  Box *bxg2;
  bool *is_periodic_z;
  bool *is_periodic_y;
  bool *is_periodic_x;
  Array<int,_27> kmap;
  Array<int,_27> jmap;
  Array<int,_27> imap;
  undefined1 local_1030 [16];
  anon_class_832_12_de08ac0f *in_stack_ffffffffffffefe0;
  Box *in_stack_ffffffffffffefe8;
  undefined1 auStack_ff0 [64];
  undefined1 auStack_fb0 [64];
  undefined1 auStack_f70 [64];
  int local_f30 [4];
  int local_f20 [2];
  uint local_f18;
  undefined8 local_f14;
  undefined8 local_f0c;
  undefined8 local_f04;
  uint local_efc;
  undefined1 auStack_ef8 [64];
  undefined1 auStack_eb8 [108];
  undefined1 auStack_e4c [108];
  undefined1 auStack_de0 [112];
  undefined1 auStack_d70 [64];
  undefined1 auStack_d30 [64];
  undefined1 local_cf0 [64];
  undefined1 auStack_cb0 [64];
  undefined1 auStack_c70 [64];
  undefined1 auStack_c30 [64];
  undefined1 auStack_bf0 [64];
  undefined1 auStack_bb0 [108];
  undefined1 auStack_b44 [108];
  undefined1 auStack_ad8 [112];
  undefined1 auStack_a68 [64];
  undefined1 local_a28 [64];
  undefined1 auStack_9e8 [64];
  undefined1 auStack_9a8 [108];
  undefined1 auStack_93c [108];
  undefined1 auStack_8d0 [112];
  undefined1 auStack_860 [64];
  undefined1 auStack_820 [64];
  undefined1 local_7e0 [64];
  undefined1 auStack_7a0 [64];
  undefined1 auStack_760 [64];
  undefined1 auStack_720 [64];
  undefined1 auStack_6e0 [64];
  undefined1 auStack_6a0 [108];
  undefined1 auStack_634 [108];
  undefined1 auStack_5c8 [112];
  undefined1 auStack_558 [64];
  undefined8 local_518;
  undefined1 local_510 [64];
  undefined1 auStack_4d0 [108];
  undefined1 auStack_464 [108];
  undefined1 auStack_3f8 [108];
  int local_38c [4];
  int local_37c [2];
  uint local_374;
  undefined8 local_370;
  undefined8 local_368;
  undefined8 local_360;
  uint local_358;
  undefined1 auStack_350 [64];
  undefined1 local_310 [64];
  undefined1 auStack_2d0 [68];
  Box local_28c;
  int local_270 [4];
  int local_260 [2];
  uint local_258;
  Box local_254;
  Box *local_238;
  Box local_22c;
  Box *local_210;
  Box local_204;
  Box *local_1e8;
  byte local_1d9;
  byte *local_1d8;
  byte local_1c9;
  byte *local_1c8;
  byte local_1b9;
  byte *local_1b8;
  undefined1 local_1ac [108];
  undefined1 local_140 [108];
  undefined1 local_d4 [108];
  undefined8 local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  int *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_68 = in_XMM0_Qa;
  local_60 = in_R9;
  local_58 = in_R8;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  local_38 = in_RDI;
  memcpy(local_d4,&DAT_016b8810,0x6c);
  memcpy(local_140,&DAT_016b887c,0x6c);
  memcpy(local_1ac,&DAT_016b88e8,0x6c);
  local_1b9 = amrex::Geometry::isPeriodic(in_stack_00000020,0);
  local_1b8 = &local_1b9;
  local_1c9 = amrex::Geometry::isPeriodic(in_stack_00000020,1);
  local_1c8 = &local_1c9;
  local_1d9 = amrex::Geometry::isPeriodic(in_stack_00000020,2);
  local_1d8 = &local_1d9;
  local_8 = local_38;
  local_c = 2;
  local_204.smallend.vect._0_8_ = *(undefined8 *)local_38;
  local_204.smallend.vect[2] = local_38[2];
  local_204.bigend.vect[0] = local_38[3];
  local_204.bigend.vect._4_8_ = *(undefined8 *)(local_38 + 4);
  local_204.btype.itype = local_38[6];
  amrex::Box::grow(&local_204,2);
  local_1e8 = &local_204;
  local_18 = local_38;
  local_1c = 3;
  local_22c.smallend.vect._0_8_ = *(undefined8 *)local_38;
  local_22c.smallend.vect[2] = local_38[2];
  local_22c.bigend.vect[0] = local_38[3];
  local_22c.bigend.vect._4_8_ = *(undefined8 *)(local_38 + 4);
  local_22c.btype.itype = local_38[6];
  amrex::Box::grow(&local_22c,3);
  local_210 = &local_22c;
  local_28 = local_38;
  local_2c = 4;
  local_254.smallend.vect._0_8_ = *(undefined8 *)local_38;
  local_254.smallend.vect[2] = local_38[2];
  local_254.bigend.vect[0] = local_38[3];
  local_254.bigend.vect._4_8_ = *(undefined8 *)(local_38 + 4);
  local_254.btype.itype = local_38[6];
  amrex::Box::grow(&local_254,4);
  local_238 = &local_254;
  pBVar1 = amrex::Geometry::Domain(in_stack_00000020);
  local_28c.smallend.vect._0_8_ = *(undefined8 *)(pBVar1->smallend).vect;
  local_28c._8_8_ = *(undefined8 *)((pBVar1->smallend).vect + 2);
  local_28c.bigend.vect._4_8_ = *(undefined8 *)((pBVar1->bigend).vect + 1);
  local_28c.btype.itype = (pBVar1->btype).itype;
  local_270._0_8_ = local_28c.smallend.vect._0_8_;
  local_270._8_8_ = local_28c._8_8_;
  local_260 = (int  [2])local_28c.bigend.vect._4_8_;
  local_258 = local_28c.btype.itype;
  if ((*local_1b8 & 1) != 0) {
    amrex::Box::grow(&local_28c,0,2);
  }
  if ((*local_1c8 & 1) != 0) {
    amrex::Box::grow(&local_28c,1,2);
  }
  if ((*local_1d8 & 1) != 0) {
    amrex::Box::grow(&local_28c,2,2);
  }
  memcpy(local_310,local_60,0x3c);
  memcpy(auStack_2d0,in_stack_00000008,0x3c);
  amrex::
  ParallelFor<Redistribution::MakeStateRedistUtils(amrex::Box_const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Geometry_const&,double)::__0>
            (in_stack_ffffffffffffefe8,(anon_class_128_2_d0b7bf2c *)in_stack_ffffffffffffefe0);
  memcpy(local_510,local_58,0x3c);
  memcpy(auStack_4d0,local_d4,0x6c);
  memcpy(auStack_464,local_140,0x6c);
  memcpy(auStack_3f8,local_1ac,0x6c);
  local_38c[0] = local_28c.smallend.vect[0];
  local_38c[1] = local_28c.smallend.vect[1];
  local_38c[2] = local_28c.smallend.vect[2];
  local_38c[3] = local_28c.bigend.vect[0];
  local_37c[0] = local_28c.bigend.vect[1];
  local_37c[1] = local_28c.bigend.vect[2];
  local_374 = local_28c.btype.itype;
  local_370 = *(undefined8 *)(local_210->smallend).vect;
  local_368 = *(undefined8 *)((local_210->smallend).vect + 2);
  local_360 = *(undefined8 *)((local_210->bigend).vect + 1);
  local_358 = (local_210->btype).itype;
  memcpy(auStack_350,local_60,0x3c);
  amrex::
  ParallelFor<Redistribution::MakeStateRedistUtils(amrex::Box_const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Geometry_const&,double)::__1>
            (in_stack_ffffffffffffefe8,(anon_class_512_7_28e1908b *)in_stack_ffffffffffffefe0);
  memcpy(local_7e0,local_40,0x3c);
  memcpy(auStack_7a0,in_stack_00000010,0x3c);
  memcpy(auStack_760,local_48,0x3c);
  memcpy(auStack_720,local_60,0x3c);
  memcpy(auStack_6e0,local_58,0x3c);
  memcpy(auStack_6a0,local_d4,0x6c);
  memcpy(auStack_634,local_140,0x6c);
  memcpy(auStack_5c8,local_1ac,0x6c);
  memcpy(auStack_558,in_stack_00000008,0x3c);
  local_518 = local_68;
  amrex::
  ParallelFor<Redistribution::MakeStateRedistUtils(amrex::Box_const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Geometry_const&,double)::__2>
            (in_stack_ffffffffffffefe8,(anon_class_720_10_ba4da4ea *)in_stack_ffffffffffffefe0);
  memcpy(local_a28,local_40,0x3c);
  memcpy(auStack_9e8,local_58,0x3c);
  memcpy(auStack_9a8,local_d4,0x6c);
  memcpy(auStack_93c,local_140,0x6c);
  memcpy(auStack_8d0,local_1ac,0x6c);
  memcpy(auStack_860,in_stack_00000008,0x3c);
  memcpy(auStack_820,local_60,0x3c);
  amrex::
  ParallelFor<Redistribution::MakeStateRedistUtils(amrex::Box_const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Geometry_const&,double)::__3>
            (in_stack_ffffffffffffefe8,(anon_class_584_7_dc75e390 *)in_stack_ffffffffffffefe0);
  memcpy(local_cf0,local_40,0x3c);
  memcpy(auStack_cb0,in_stack_00000010,0x3c);
  memcpy(auStack_c70,in_stack_00000008,0x3c);
  memcpy(auStack_c30,local_48,0x3c);
  memcpy(auStack_bf0,local_58,0x3c);
  memcpy(auStack_bb0,local_d4,0x6c);
  memcpy(auStack_b44,local_140,0x6c);
  memcpy(auStack_ad8,local_1ac,0x6c);
  memcpy(auStack_a68,local_60,0x3c);
  amrex::
  ParallelFor<Redistribution::MakeStateRedistUtils(amrex::Box_const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Geometry_const&,double)::__4>
            (in_stack_ffffffffffffefe8,(anon_class_712_9_bf465999 *)in_stack_ffffffffffffefe0);
  memcpy(local_1030,local_48,0x3c);
  memcpy(auStack_ff0,in_stack_00000018,0x3c);
  memcpy(auStack_fb0,local_50,0x3c);
  memcpy(auStack_f70,local_58,0x3c);
  local_f30[0] = local_28c.smallend.vect[0];
  local_f30[1] = local_28c.smallend.vect[1];
  local_f30[2] = local_28c.smallend.vect[2];
  local_f30[3] = local_28c.bigend.vect[0];
  local_f20[0] = local_28c.bigend.vect[1];
  local_f20[1] = local_28c.bigend.vect[2];
  local_f18 = local_28c.btype.itype;
  local_f14 = *(undefined8 *)(local_1e8->smallend).vect;
  local_f0c = *(undefined8 *)((local_1e8->smallend).vect + 2);
  local_f04 = *(undefined8 *)((local_1e8->bigend).vect + 1);
  local_efc = (local_1e8->btype).itype;
  memcpy(auStack_ef8,in_stack_00000008,0x3c);
  memcpy(auStack_eb8,local_d4,0x6c);
  memcpy(auStack_e4c,local_140,0x6c);
  memcpy(auStack_de0,local_1ac,0x6c);
  memcpy(auStack_d70,local_60,0x3c);
  memcpy(auStack_d30,in_stack_00000010,0x3c);
  amrex::
  ParallelFor<Redistribution::MakeStateRedistUtils(amrex::Box_const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Geometry_const&,double)::__5>
            (in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0);
  return;
}

Assistant:

void
Redistribution::MakeStateRedistUtils ( Box const& bx,
                                       Array4<EBCellFlag const> const& flag,
                                       Array4<Real const> const& vfrac,
                                       Array4<Real const> const& ccent,
                                       Array4<int  const> const& itracker,
                                       Array4<Real      > const& nrs,
                                       Array4<Real      > const& alpha,
                                       Array4<Real      > const& nbhd_vol,
                                       Array4<Real      > const& cent_hat,
                                       Geometry const& lev_geom,
                                       Real target_vol)
{
    // Note that itracker has {4 in 2D, 8 in 3D} components and all are initialized to zero
    // We will add to the first component every time this cell is included in a merged neighborhood,
    //    either by merging or being merged
    //
    // In 2D, we identify the cells in the remaining three components with the following ordering
    //
    // ^  6 7 8
    // |  4   5
    // j  1 2 3
    //   i --->
    //
    // In 3D, We identify the cells in the remaining three components with the following ordering
    //
    //    at k-1   |   at k  |   at k+1
    //
    // ^  15 16 17 |  6 7 8  |  24 25 26
    // |  12 13 14 |  4   5  |  21 22 23
    // j  9  10 11 |  1 2 3  |  18 19 20
    //   i --->
    //
    // Note the first component of each of these arrays should never be used
    //
#if (AMREX_SPACEDIM == 2)
    Array<int,9> imap{0,-1, 0, 1,-1, 1,-1, 0, 1};
    Array<int,9> jmap{0,-1,-1,-1, 0, 0, 1, 1, 1};
    Array<int,9> kmap{0, 0, 0, 0, 0, 0, 0, 0, 0};
#else
    Array<int,27>    imap{0,-1, 0, 1,-1, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1};
    Array<int,27>    jmap{0,-1,-1,-1, 0, 0, 1, 1, 1,-1,-1,-1, 0, 0, 0, 1, 1, 1,-1,-1,-1, 0, 0, 0, 1, 1, 1};
    Array<int,27>    kmap{0, 0, 0, 0, 0, 0, 0, 0, 0,-1,-1,-1,-1,-1,-1,-1,-1,-1, 1, 1, 1, 1, 1, 1, 1, 1, 1};
#endif

    AMREX_D_TERM(const auto& is_periodic_x = lev_geom.isPeriodic(0);,
                 const auto& is_periodic_y = lev_geom.isPeriodic(1);,
                 const auto& is_periodic_z = lev_geom.isPeriodic(2););

    Box const& bxg2 = amrex::grow(bx,2);
    Box const& bxg3 = amrex::grow(bx,3);
    Box const& bxg4 = amrex::grow(bx,4);

    const Box domain = lev_geom.Domain();

    Box domain_per_grown = domain;
    if (is_periodic_x) domain_per_grown.grow(0,2);
    if (is_periodic_y) domain_per_grown.grow(1,2);
#if (AMREX_SPACEDIM == 3)
    if (is_periodic_z) domain_per_grown.grow(2,2);
#endif

    amrex::ParallelFor(bxg3,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        // Everyone is in their own neighborhood at least
        nrs(i,j,k) = 1.;
        alpha(i,j,k,0) = 1.;
        alpha(i,j,k,1) = 1.;
    });

    // nrs captures how many neighborhoods (r,s) is in
    amrex::ParallelFor(bxg4,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
        for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
        {
            int r = i+imap[itracker(i,j,k,i_nbor)];
            int s = j+jmap[itracker(i,j,k,i_nbor)];
            int t = k+kmap[itracker(i,j,k,i_nbor)];
            if ( domain_per_grown.contains(IntVect(AMREX_D_DECL(r,s,t))) &&
                 bxg3.contains(IntVect(AMREX_D_DECL(r,s,t))) )
            {
                amrex::Gpu::Atomic::Add(&nrs(r,s,t),1.0_rt);
            }
        }
    });

    amrex::ParallelFor(bxg2,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (!flag(i,j,k).isCovered())
        {
            // Start with the vfrac of (i,j,k)
            nbhd_vol(i,j,k) = vfrac(i,j,k) / nrs(i,j,k);
            Real vol_of_nbors = 0.;

            // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
            for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
            {
                int r = i+imap[itracker(i,j,k,i_nbor)];
                int s = j+jmap[itracker(i,j,k,i_nbor)];
                int t = k+kmap[itracker(i,j,k,i_nbor)];
                amrex::Gpu::Atomic::Add(&nbhd_vol(i,j,k),vfrac(r,s,t) / nrs(r,s,t));
                vol_of_nbors += vfrac(r,s,t);
            }

            if (itracker(i,j,k,0) > 0)
                alpha(i,j,k,1) = (target_vol - vfrac(i,j,k)) / vol_of_nbors;

        } else {
            nbhd_vol(i,j,k) = 0.;
            alpha(i,j,k,0) = 0.;
            alpha(i,j,k,1) = 0.;
        }
    });

    // Define how much each cell keeps
    amrex::ParallelFor(bxg2,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (!flag(i,j,k).isCovered())
        {
            // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
            for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
            {
                int r = i+imap[itracker(i,j,k,i_nbor)];
                int s = j+jmap[itracker(i,j,k,i_nbor)];
                int t = k+kmap[itracker(i,j,k,i_nbor)];
                amrex::Gpu::Atomic::Add(&alpha(r,s,t,0),-(alpha(i,j,k,1)/nrs(r,s,t)));
            }
        }
    });

    // Redefine nbhd_vol
    amrex::ParallelFor(bxg2,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (!flag(i,j,k).isCovered())
        {
            nbhd_vol(i,j,k)  = alpha(i,j,k,0) * vfrac(i,j,k);

            // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
            for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
            {
                int r = i+imap[itracker(i,j,k,i_nbor)];
                int s = j+jmap[itracker(i,j,k,i_nbor)];
                int t = k+kmap[itracker(i,j,k,i_nbor)];
                amrex::Gpu::Atomic::Add(&nbhd_vol(i,j,k),alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t));
            }
        }
    });

    // Define xhat,yhat,zhat (from Berger and Guliani)
    amrex::ParallelFor(bxg3,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (vfrac(i,j,k) > 0.0)
        {
            AMREX_D_TERM(cent_hat(i,j,k,0) = ccent(i,j,k,0);,
                         cent_hat(i,j,k,1) = ccent(i,j,k,1);,
                         cent_hat(i,j,k,2) = ccent(i,j,k,2););

            if ( itracker(i,j,k,0) > 0 &&
                 domain_per_grown.contains(IntVect(AMREX_D_DECL(i,j,k))) &&
                             bxg2.contains(IntVect(AMREX_D_DECL(i,j,k))) ) {

                AMREX_D_TERM(cent_hat(i,j,k,0) = ccent(i,j,k,0) * alpha(i,j,k,0) *vfrac(i,j,k);,
                             cent_hat(i,j,k,1) = ccent(i,j,k,1) * alpha(i,j,k,0) *vfrac(i,j,k);,
                             cent_hat(i,j,k,2) = ccent(i,j,k,2) * alpha(i,j,k,0) *vfrac(i,j,k););

                // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
                for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
                {
                    int ii = imap[itracker(i,j,k,i_nbor)]; int r = i+ii;
                    int jj = jmap[itracker(i,j,k,i_nbor)]; int s = j+jj;
                    int kk = kmap[itracker(i,j,k,i_nbor)]; int t = k+kk;

                    AMREX_D_TERM(cent_hat(i,j,k,0) += (ccent(r,s,t,0) + ii) * alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t);,
                                 cent_hat(i,j,k,1) += (ccent(r,s,t,1) + jj) * alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t);,
                                 cent_hat(i,j,k,2) += (ccent(r,s,t,2) + kk) * alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t););
                }

                AMREX_D_TERM(cent_hat(i,j,k,0) /= nbhd_vol(i,j,k);,
                             cent_hat(i,j,k,1) /= nbhd_vol(i,j,k);,
                             cent_hat(i,j,k,2) /= nbhd_vol(i,j,k););
            }
        } else {

                AMREX_D_TERM(cent_hat(i,j,k,0) = 1.e40;,
                             cent_hat(i,j,k,1) = 1.e40;,
                             cent_hat(i,j,k,2) = 1.e40;);
        }
    });
}